

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  pointer pbVar2;
  bool bVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  undefined4 extraout_var;
  cmOutputConverter *outputConverter;
  string *i;
  pointer s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  __uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  local_1d0;
  string local_1c8;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  string *local_170;
  string *local_168;
  string local_160;
  RuleVariables local_140;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_168 = objectFileName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CMAKE_EXPORT_COMPILE_COMMANDS",(allocator<char> *)&local_160);
  bVar3 = cmMakefile::IsOn(this_00,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  if (bVar3) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_140);
    local_140.Language = (language->_M_dataplus)._M_p;
    std::__cxx11::string::string((string *)&local_160,(string *)sourceFileName);
    bVar3 = cmsys::SystemTools::FileIsFullPath(sourceFileName);
    if (!bVar3) {
      pcVar4 = GetGlobalGenerator(this);
      psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath(&local_1c8,&local_160,psVar5);
      std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    local_170 = sourceFileName;
    cmOutputConverter::ConvertToOutputFormat
              (&local_1c8,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_160,SHELL);
    std::__cxx11::string::operator=((string *)&local_160,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    local_140.Source = local_160._M_dataplus._M_p;
    local_140.Object = (local_168->_M_dataplus)._M_p;
    local_140.ObjectDir = (objectDir->_M_dataplus)._M_p;
    local_140.ObjectFileDir = (objectFileDir->_M_dataplus)._M_p;
    local_140.Flags = (flags->_M_dataplus)._M_p;
    local_140.Defines = (defines->_M_dataplus)._M_p;
    local_140.Includes = (includes->_M_dataplus)._M_p;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = std::operator==(language,"CUDA");
    if (bVar3) {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&local_1d0);
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      if (!bVar3) {
        pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"CUDA_PTX_COMPILATION",(allocator<char> *)&local_1d0);
        cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::assign((char *)&local_1c8);
      psVar5 = cmMakefile::GetRequiredDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_1c8);
      cmSystemTools::ExpandListArgument(psVar5,&local_188,false);
    }
    else {
      std::operator+(&local_1a8,"CMAKE_",language);
      std::operator+(&local_1c8,&local_1a8,"_COMPILE_OBJECT");
      std::__cxx11::string::~string((string *)&local_1a8);
      psVar5 = cmMakefile::GetRequiredDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_1c8);
      cmSystemTools::ExpandListArgument(psVar5,&local_188,false);
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    local_1d0._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
         (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
           _vptr_cmLocalGenerator[5])();
    pbVar2 = local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1d0._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
    for (s = local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; s != pbVar2; s = s + 1) {
      outputConverter =
           &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
            super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 local_1d0._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
                 outputConverter,s,&local_140);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_1c8,this->LocalGenerator,&local_188,&local_1a8,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_1a8);
    pcVar4 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar4,&local_1c8,local_170);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&local_1d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    std::__cxx11::string::~string((string *)&local_160);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes)
{
  if (!this->Makefile->IsOn("CMAKE_EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (language == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + language + "_COMPILE_OBJECT";
    const std::string& compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::string& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName);
}